

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O3

void __thiscall cfd::core::TapBranch::AddBranch(TapBranch *this,ByteData256 *commitment)

{
  CfdException *this_00;
  string local_40;
  
  ::std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
  emplace_back<cfd::core::ByteData256_const&>
            ((vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> *)
             &this->branch_list_,commitment);
  if ((ulong)(((long)(this->branch_list_).
                     super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->branch_list_).
                     super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1111111111111111) < 0x81)
  {
    return;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"tapbranch maximum over.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,&local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void TapBranch::AddBranch(const ByteData256& commitment) {
  branch_list_.emplace_back(commitment);
  if (branch_list_.size() > TaprootScriptTree::kTaprootControlMaxNodeCount) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "tapbranch maximum over.");
  }
}